

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.cpp
# Opt level: O1

Ref<embree::Image> __thiscall embree::loadSTB(embree *this,FileName *fileName)

{
  pointer pcVar1;
  Image *pIVar2;
  stbi_uc *__ptr;
  ImageT<embree::Col4<unsigned_char>_> *this_00;
  long lVar3;
  runtime_error *this_01;
  size_t sVar4;
  long lVar5;
  size_t width_00;
  size_t sVar6;
  int channels;
  int height;
  int width;
  int local_94;
  int local_90;
  int local_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  char local_78 [24];
  Image *local_60;
  size_t local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = (fileName->filename)._M_dataplus._M_p;
  local_88 = (undefined1  [8])local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar1,pcVar1 + (fileName->filename)._M_string_length);
  __ptr = stbi_load((char *)local_88,&local_8c,&local_90,&local_94,0);
  if (local_88 != (undefined1  [8])local_78) {
    operator_delete((void *)local_88);
  }
  local_60 = (Image *)this;
  if (__ptr != (stbi_uc *)0x0) {
    this_00 = (ImageT<embree::Col4<unsigned_char>_> *)operator_new(0x48);
    width_00 = (size_t)local_8c;
    sVar4 = (size_t)local_90;
    pcVar1 = (fileName->filename)._M_dataplus._M_p;
    local_88 = (undefined1  [8])local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar1,pcVar1 + (fileName->filename)._M_string_length);
    ImageT<embree::Col4<unsigned_char>_>::ImageT(this_00,width_00,sVar4,(string *)local_88);
    if (local_88 != (undefined1  [8])local_78) {
      operator_delete((void *)local_88);
    }
    local_58 = sVar4;
    if (local_90 != 0) {
      lVar5 = 0;
      sVar4 = 0;
      do {
        if (local_8c != 0) {
          sVar6 = 0;
          do {
            lVar3 = (long)local_94;
            if (lVar3 < 1) {
              local_88._0_4_ = 0.0;
            }
            else {
              local_88._0_4_ = (float)__ptr[(lVar5 + sVar6) * lVar3] * 0.003921569;
            }
            local_88._4_4_ = local_88._0_4_;
            if (1 < local_94) {
              local_88._4_4_ = (float)__ptr[(lVar5 + sVar6) * lVar3 + 1] * 0.003921569;
            }
            if (local_94 < 3) {
              fStack_80 = (float)local_88._0_4_;
              if (local_94 != 1) {
                fStack_80 = 0.0;
              }
            }
            else {
              fStack_80 = (float)__ptr[(lVar5 + sVar6) * lVar3 + 2] * 0.003921569;
            }
            fStack_7c = 1.0;
            if (3 < local_94) {
              fStack_7c = (float)__ptr[(lVar5 + sVar6) * lVar3 + 3] * 0.003921569;
            }
            (*(this_00->super_Image).super_RefCount._vptr_RefCount[5])(this_00,sVar6,sVar4,local_88)
            ;
            sVar6 = sVar6 + 1;
          } while (width_00 != sVar6);
        }
        sVar4 = sVar4 + 1;
        lVar5 = lVar5 + width_00;
      } while (sVar4 != local_58);
    }
    free(__ptr);
    pIVar2 = local_60;
    (local_60->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
    (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
    return (Ref<embree::Image>)pIVar2;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (fileName->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (fileName->filename)._M_string_length);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 "Could not load ",&local_50);
  std::runtime_error::runtime_error(this_01,(string *)local_88);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<Image> loadSTB(const FileName& fileName)
  {
    int width, height, channels;
    unsigned char *pixels = stbi_load(fileName.str().c_str(), &width, &height, &channels, 0);
    if(pixels == nullptr) {
      THROW_RUNTIME_ERROR("Could not load " + fileName.str());
    }

    Image* out = new Image4uc(width, height, fileName);
    const float rcpMaxColor = 1.f/255.f;
    for (size_t y = 0; y < height; y++)
    {
      for (size_t x = 0; x < width; x++)
      {
        float r = (channels > 0) ? (float(pixels[(y*width+x)*channels+0]) * rcpMaxColor) : 0.f;
        float g = (channels > 1) ? (float(pixels[(y*width+x)*channels+1]) * rcpMaxColor) : r;
        float b = (channels > 2) ? (float(pixels[(y*width+x)*channels+2]) * rcpMaxColor) : ((channels == 1) ? r : 0.f);
        float a = (channels > 3) ? (float(pixels[(y*width+x)*channels+3]) * rcpMaxColor) : 1.f;
        out->set(x, y, Color4(r,g,b,a));
      }
    }

    stbi_image_free(pixels);

    return out;
  }